

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O3

int archive_write_add_filter_bzip2(archive *_a)

{
  int iVar1;
  archive_write_filter *paVar2;
  undefined4 *__ptr;
  archive_write_program_data *paVar3;
  
  paVar2 = __archive_write_allocate_filter(_a);
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_bzip2");
  if (iVar1 != -0x1e) {
    __ptr = (undefined4 *)calloc(1,0x10);
    if (__ptr != (undefined4 *)0x0) {
      *__ptr = 9;
      paVar2->data = __ptr;
      paVar2->options = archive_compressor_bzip2_options;
      paVar2->close = archive_compressor_bzip2_close;
      paVar2->free = archive_compressor_bzip2_free;
      paVar2->open = archive_compressor_bzip2_open;
      paVar2->code = 2;
      paVar2->name = "bzip2";
      paVar3 = __archive_write_program_allocate("bzip2");
      *(archive_write_program_data **)(__ptr + 2) = paVar3;
      if (paVar3 != (archive_write_program_data *)0x0) {
        *__ptr = 0;
        archive_set_error(_a,-1,"Using external bzip2 program");
        return -0x14;
      }
      free(__ptr);
    }
    archive_set_error(_a,0xc,"Out of memory");
  }
  return -0x1e;
}

Assistant:

int
archive_write_add_filter_bzip2(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct private_data *data;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_bzip2");

	data = calloc(1, sizeof(*data));
	if (data == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	data->compression_level = 9; /* default */

	f->data = data;
	f->options = &archive_compressor_bzip2_options;
	f->close = &archive_compressor_bzip2_close;
	f->free = &archive_compressor_bzip2_free;
	f->open = &archive_compressor_bzip2_open;
	f->code = ARCHIVE_FILTER_BZIP2;
	f->name = "bzip2";
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	return (ARCHIVE_OK);
#else
	data->pdata = __archive_write_program_allocate("bzip2");
	if (data->pdata == NULL) {
		free(data);
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	data->compression_level = 0;
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Using external bzip2 program");
	return (ARCHIVE_WARN);
#endif
}